

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL_mock::GLCompiledProgram::addUniqueUniform
          (GLCompiledProgram *this,ShaderSpecUniform *newUniform)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pGVar2;
  size_t __n;
  pointer pcVar3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  pointer __rhs;
  string local_70;
  GLShaderUniform local_50;
  
  __rhs = (this->uniforms).
          super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pGVar2 = (this->uniforms).
           super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __n = (newUniform->name)._M_string_length;
  do {
    if (__rhs == pGVar2) {
      paVar1 = &local_50.name.field_2;
      pcVar3 = (newUniform->name)._M_dataplus._M_p;
      local_50.name._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar3,pcVar3 + __n);
      local_50.type = newUniform->type;
      local_50.isSet = false;
      std::
      vector<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>
      ::emplace_back<polyscope::render::backend_openGL_mock::GLShaderUniform>
                (&this->uniforms,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.name._M_dataplus._M_p != paVar1) {
LAB_002948b2:
        operator_delete(local_50.name._M_dataplus._M_p);
      }
      return;
    }
    if (((__rhs->name)._M_string_length == __n) &&
       ((__n == 0 ||
        (iVar4 = bcmp((__rhs->name)._M_dataplus._M_p,(newUniform->name)._M_dataplus._M_p,__n),
        iVar4 == 0)))) {
      if (__rhs->type == newUniform->type) {
        return;
      }
      std::operator+(&local_50.name,"uniform ",&__rhs->name);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_70.field_2._M_allocated_capacity = *psVar6;
        local_70.field_2._8_8_ = plVar5[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar6;
        local_70._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_70._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      exception(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.name._M_dataplus._M_p == &local_50.name.field_2) {
        return;
      }
      goto LAB_002948b2;
    }
    __rhs = __rhs + 1;
  } while( true );
}

Assistant:

void GLCompiledProgram::addUniqueUniform(ShaderSpecUniform newUniform) {
  for (GLShaderUniform& u : uniforms) {
    if (u.name == newUniform.name) {

      // if it occurs twice, confirm that the occurences match
      if (u.type != newUniform.type) exception("uniform " + u.name + " appears twice in program with different types");

      return;
    }
  }
  uniforms.push_back(GLShaderUniform{newUniform.name, newUniform.type, false});
}